

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

LocalSet * __thiscall wasm::DataFlow::Graph::getSet(Graph *this,Node *node)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false> local_30;
  _Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false> local_28;
  iterator iter;
  Node *node_local;
  Graph *this_local;
  
  iter.super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>)
           (_Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>)
           node;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::DataFlow::Node_*,_wasm::Expression_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>_>
       ::find(&this->nodeParentMap,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::DataFlow::Node_*,_wasm::Expression_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>_>
       ::end(&this->nodeParentMap);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (Graph *)0x0;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false,_false>
                           *)&local_28);
    this_local = (Graph *)Expression::dynCast<wasm::LocalSet>(ppVar2->second);
  }
  return (LocalSet *)this_local;
}

Assistant:

LocalSet* getSet(Node* node) {
    auto iter = nodeParentMap.find(node);
    if (iter == nodeParentMap.end()) {
      return nullptr;
    }
    return iter->second->dynCast<LocalSet>();
  }